

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Clear<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  uint uVar1;
  LogMessage *pLVar2;
  ulong uVar3;
  LogMessage local_68 [63];
  LogFinisher local_29;
  
  uVar1 = this->current_size_;
  if ((int)uVar1 < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x6e8);
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_68,"CHECK failed: (n) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=(&local_29,pLVar2);
    google::protobuf::internal::LogMessage::~LogMessage(local_68);
  }
  else if ((ulong)uVar1 != 0) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + 1;
      google::protobuf::FieldDescriptorProto::Clear();
    } while (uVar1 != uVar3);
    this->current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}